

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O3

pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
* __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::insert(pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
         *__return_storage_ptr__,
        small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
        *this,value_type *x)

{
  uint uVar1;
  unsigned_long uVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
  *paVar6;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar7;
  bool bVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool>
  pVar10;
  
  uVar1 = this->size_;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 0) {
LAB_001260a4:
    pVar10 = std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
             ::_M_insert_unique<std::pair<unsigned_long_const,ctemplate::TemplateString>const&>
                       ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
                         *)&(this->field_2).dummy_,x);
    bVar8 = pVar10.second;
    (__return_storage_ptr__->first).array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
    (__return_storage_ptr__->first).hash_iter_._M_node = pVar10.first._M_node._M_node;
  }
  else {
    if (uVar5 != 0) {
      paVar6 = &this->field_2;
      uVar9 = uVar5;
      do {
        if (*(unsigned_long *)paVar6 == x->first) {
          (__return_storage_ptr__->first).array_iter_ =
               (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
               paVar6;
          (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
          bVar8 = false;
          goto LAB_00126105;
        }
        paVar6 = (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
                  *)((long)paVar6 + 0x28);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      if (uVar1 == 4) {
        ConvertToRealMap(this);
        goto LAB_001260a4;
      }
    }
    pMVar7 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             ((long)&this->field_2 + uVar5 * 0x28);
    *(TemplateId *)((long)&this->field_2 + uVar5 * 0x28 + 0x20) = (x->second).id_;
    uVar2 = x->first;
    pcVar3 = (x->second).ptr_;
    uVar4 = *(undefined8 *)&(x->second).is_immutable_;
    *(size_t *)((long)&this->field_2 + uVar5 * 0x28 + 0x10) = (x->second).length_;
    *(undefined8 *)((long)&this->field_2 + uVar5 * 0x28 + 0x18) = uVar4;
    *(unsigned_long *)pMVar7->space_ = uVar2;
    *(char **)((long)&this->field_2 + uVar5 * 0x28 + 8) = pcVar3;
    this->size_ = uVar1 + 1;
    (__return_storage_ptr__->first).array_iter_ = pMVar7;
    (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
    bVar8 = true;
  }
LAB_00126105:
  __return_storage_ptr__->second = bVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& x) {
    key_equal compare;

    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, x.first)) {
          return std::make_pair(iterator(array_ + i), false);
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();  // Invalidates all iterators!
        std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
        return std::make_pair(iterator(ret.first), ret.second);
      } else {
        array_[size_].Init(x);
        return std::make_pair(iterator(array_ + size_++), true);
      }
    } else {
      std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
      return std::make_pair(iterator(ret.first), ret.second);
    }
  }